

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

bool __thiscall minihttp::HttpSocket::SendRequest(HttpSocket *this,Request *req,bool enqueue)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  stringstream r;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar3 = false;
  if (((req->host)._M_string_length != 0) && (bVar3 = false, req->port != 0)) {
    sVar1 = (req->post).data._M_string_length;
    std::__cxx11::stringstream::stringstream(local_1b8);
    pcVar6 = "POST ";
    if (sVar1 == 0) {
      pcVar6 = "GET ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,(ulong)(sVar1 == 0) ^ 5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(req->resource)._M_dataplus._M_p,(req->resource)._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," HTTP/1.1",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Host: ",6);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(req->host)._M_dataplus._M_p,(req->host)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
    if (this->_keep_alive == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Connection: close",0x11);
      poVar5 = local_1a8;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Connection: Keep-Alive",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\r\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Keep-Alive: ",0xc);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
    if ((this->_user_agent)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"User-Agent: ",0xc);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->_user_agent)._M_dataplus._M_p,
                          (this->_user_agent)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
    }
    if ((this->_accept_encoding)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Accept-Encoding: ",0x11);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->_accept_encoding)._M_dataplus._M_p,
                          (this->_accept_encoding)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
    }
    if (sVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Content-Length: ",0x10);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Content-Type: application/x-www-form-urlencoded",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\r\n",2);
    }
    sVar2 = (req->extraGetHeaders)._M_string_length;
    if (sVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(req->extraGetHeaders)._M_dataplus._M_p,sVar2);
      iVar4 = std::__cxx11::string::compare
                        ((ulong)&req->extraGetHeaders,(req->extraGetHeaders)._M_string_length - 2,
                         (char *)0xffffffffffffffff);
      if (iVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\r\n",2);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\r\n",2);
    if (sVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(req->post).data._M_dataplus._M_p,(req->post).data._M_string_length);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&req->header,(string *)local_1d8);
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0],local_1c8[0] + 1);
    }
    bVar3 = _EnqueueOrSend(this,req,enqueue);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return bVar3;
}

Assistant:

bool HttpSocket::SendRequest(Request& req, bool enqueue)
{
    if(req.host.empty() || !req.port)
        return false;

    const bool post = !req.post.empty();

    std::stringstream r;
    const char *crlf = "\r\n";
    r << (post ? "POST " : "GET ") << req.resource << " HTTP/1.1" << crlf;
    r << "Host: " << req.host << crlf;
    if(_keep_alive)
    {
        r << "Connection: Keep-Alive" << crlf;
        r << "Keep-Alive: " << _keep_alive << crlf;
    }
    else
        r << "Connection: close" << crlf;

    if(_user_agent.length())
        r << "User-Agent: " << _user_agent << crlf;

    if(_accept_encoding.length())
        r << "Accept-Encoding: " << _accept_encoding << crlf;

    if(post)
    {
        r << "Content-Length: " << req.post.length() << crlf;
        r << "Content-Type: application/x-www-form-urlencoded" << crlf;
    }

    if(req.extraGetHeaders.length())
    {
        r << req.extraGetHeaders;
        if(req.extraGetHeaders.compare(req.extraGetHeaders.length() - 2, std::string::npos, crlf))
            r << crlf;
    }

    r << crlf; // header terminator

    // FIXME: appending this to the 'header' field is probably not a good idea
    if(post)
        r << req.post.str();

    req.header = r.str();

    return _EnqueueOrSend(req, enqueue);
}